

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_graph.c
# Opt level: O3

EcsComponent * ecs_component_from_id(ecs_world_t *world,ecs_entity_t e)

{
  EcsComponent *pEVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (ulong)((uint)(e >> 0x20) & 0xffffff);
  if ((char)(e >> 0x38) != -6) {
    uVar2 = e;
  }
  uVar3 = 0;
  if (e >> 0x38 == 0xfa) {
    uVar3 = e;
  }
  pEVar1 = (EcsComponent *)ecs_get_w_entity(world,uVar2,1);
  if (uVar3 != 0 && pEVar1 == (EcsComponent *)0x0) {
    uVar2 = uVar3 & 0xffffffff;
    pEVar1 = (EcsComponent *)ecs_get_w_entity(world,uVar2,1);
  }
  uVar2 = uVar2 & 0xff00000000000000;
  _ecs_assert(uVar2 != 0xfd00000000000000 || pEVar1 == (EcsComponent *)0x0,0xc,(char *)0x0,
              "!component || !ECS_HAS_ROLE(e, CHILDOF)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
              ,0x18);
  if (uVar2 != 0xfd00000000000000 || pEVar1 == (EcsComponent *)0x0) {
    _ecs_assert(uVar2 != 0xfe00000000000000 || pEVar1 == (EcsComponent *)0x0,0xc,(char *)0x0,
                "!component || !ECS_HAS_ROLE(e, INSTANCEOF)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                ,0x19);
    if (uVar2 != 0xfe00000000000000 || pEVar1 == (EcsComponent *)0x0) {
      return pEVar1;
    }
    __assert_fail("!component || !((e & ((ecs_entity_t)0xFF << 56)) == (((uint64_t)1 << 63) | ((ecs_entity_t)0x7E << 56)))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                  ,0x19,"const EcsComponent *ecs_component_from_id(ecs_world_t *, ecs_entity_t)");
  }
  __assert_fail("!component || !((e & ((ecs_entity_t)0xFF << 56)) == (((uint64_t)1 << 63) | ((ecs_entity_t)0x7D << 56)))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                ,0x18,"const EcsComponent *ecs_component_from_id(ecs_world_t *, ecs_entity_t)");
}

Assistant:

const EcsComponent* ecs_component_from_id(
    ecs_world_t *world,
    ecs_entity_t e)
{
    ecs_entity_t trait = 0;

    /* If this is a trait, get the trait component from the identifier */
    if (ECS_HAS_ROLE(e, TRAIT)) {
        trait = e;
        e = e & ECS_COMPONENT_MASK;
        e = ecs_entity_t_hi(e);
    }

    const EcsComponent *component = ecs_get(world, e, EcsComponent);
    if (!component && trait) {
        /* If this is a trait column and the trait is not a component, use
         * the component type of the component the trait is applied to. */
        e = ecs_entity_t_lo(trait);
        component = ecs_get(world, e, EcsComponent);
    }

    ecs_assert(!component || !ECS_HAS_ROLE(e, CHILDOF), ECS_INTERNAL_ERROR, NULL);
    ecs_assert(!component || !ECS_HAS_ROLE(e, INSTANCEOF), ECS_INTERNAL_ERROR, NULL);

    return component;
}